

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script)

{
  uint32_t uVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ConfidentialNonce local_50;
  
  ConfidentialNonce::ConfidentialNonce(&local_50);
  ByteData::ByteData((ByteData *)&local_80);
  ByteData::ByteData((ByteData *)&local_68);
  uVar1 = AddTxOut(this,value,asset,locking_script,&local_50,(ByteData *)&local_80,
                   (ByteData *)&local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  ConfidentialNonce::~ConfidentialNonce(&local_50);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script) {
  return AddTxOut(
      value, asset, locking_script, ConfidentialNonce(), ByteData(),
      ByteData());
}